

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gz_init(gz_state *state)

{
  int32_t iVar1;
  void *pvVar2;
  char *in_RDI;
  int32_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  zng_stream *strm;
  int ret;
  char *msg;
  int32_t in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  msg = in_RDI;
  pvVar2 = zng_alloc(0x105c8c);
  *(void **)(msg + 0x30) = pvVar2;
  if (*(long *)(msg + 0x30) == 0) {
    gz_error((gz_state *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,msg);
    return -1;
  }
  memset(*(void **)(msg + 0x30),0,(ulong)(uint)(*(int *)(msg + 0x2c) << 1));
  if (*(int *)(msg + 0x40) == 0) {
    pvVar2 = zng_alloc(0x105d03);
    *(void **)(msg + 0x38) = pvVar2;
    if (*(long *)(msg + 0x38) == 0) {
      zng_free((void *)0x105d29);
      gz_error((gz_state *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,msg);
      return -1;
    }
    in_RDI[0xc0] = '\0';
    in_RDI[0xc1] = '\0';
    in_RDI[0xc2] = '\0';
    in_RDI[0xc3] = '\0';
    in_RDI[0xc4] = '\0';
    in_RDI[0xc5] = '\0';
    in_RDI[0xc6] = '\0';
    in_RDI[199] = '\0';
    in_RDI[200] = '\0';
    in_RDI[0xc9] = '\0';
    in_RDI[0xca] = '\0';
    in_RDI[0xcb] = '\0';
    in_RDI[0xcc] = '\0';
    in_RDI[0xcd] = '\0';
    in_RDI[0xce] = '\0';
    in_RDI[0xcf] = '\0';
    in_RDI[0xd0] = '\0';
    in_RDI[0xd1] = '\0';
    in_RDI[0xd2] = '\0';
    in_RDI[0xd3] = '\0';
    in_RDI[0xd4] = '\0';
    in_RDI[0xd5] = '\0';
    in_RDI[0xd6] = '\0';
    in_RDI[0xd7] = '\0';
    iVar1 = zng_deflateInit2(strm,unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,
                             in_stack_fffffffffffffff8,(int32_t)((ulong)msg >> 0x20));
    if (iVar1 != 0) {
      zng_free((void *)0x105db5);
      zng_free((void *)0x105dc3);
      gz_error((gz_state *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,msg);
      return -1;
    }
    in_RDI[0x80] = '\0';
    in_RDI[0x81] = '\0';
    in_RDI[0x82] = '\0';
    in_RDI[0x83] = '\0';
    in_RDI[0x84] = '\0';
    in_RDI[0x85] = '\0';
    in_RDI[0x86] = '\0';
    in_RDI[0x87] = '\0';
  }
  *(undefined4 *)(msg + 0x28) = *(undefined4 *)(msg + 0x2c);
  if (*(int *)(msg + 0x40) == 0) {
    *(undefined4 *)(in_RDI + 0xa0) = *(undefined4 *)(msg + 0x28);
    *(undefined8 *)(in_RDI + 0x98) = *(undefined8 *)(msg + 0x38);
    *(undefined8 *)(msg + 8) = *(undefined8 *)(in_RDI + 0x98);
  }
  return 0;
}

Assistant:

static int gz_init(gz_state *state) {
    int ret;
    PREFIX3(stream) *strm = &(state->strm);

    /* allocate input buffer (double size for gzprintf) */
    state->in = (unsigned char *)zng_alloc(state->want << 1);
    if (state->in == NULL) {
        gz_error(state, Z_MEM_ERROR, "out of memory");
        return -1;
    }
    memset(state->in, 0, state->want << 1);

    /* only need output buffer and deflate state if compressing */
    if (!state->direct) {
        /* allocate output buffer */
        state->out = (unsigned char *)zng_alloc(state->want);
        if (state->out == NULL) {
            zng_free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }

        /* allocate deflate memory, set up for gzip compression */
        strm->zalloc = NULL;
        strm->zfree = NULL;
        strm->opaque = NULL;
        ret = PREFIX(deflateInit2)(strm, state->level, Z_DEFLATED, MAX_WBITS + 16, DEF_MEM_LEVEL, state->strategy);
        if (ret != Z_OK) {
            zng_free(state->out);
            zng_free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        strm->next_in = NULL;
    }

    /* mark state as initialized */
    state->size = state->want;

    /* initialize write buffer if compressing */
    if (!state->direct) {
        strm->avail_out = state->size;
        strm->next_out = state->out;
        state->x.next = strm->next_out;
    }
    return 0;
}